

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O2

void __thiscall json_service::compiles5cr(json_service *this,object *f)

{
  double dVar1;
  const_iterator cVar2;
  double *pdVar3;
  ostream *poVar4;
  runtime_error *this_00;
  undefined1 local_1c0 [48];
  ostringstream oss;
  string local_180 [360];
  
  cppcms::string_key::string_key((string_key *)&oss,"member");
  cVar2 = std::
          _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
          ::find(&f->_M_t,(string_key *)&oss);
  if ((_Rb_tree_header *)cVar2._M_node == &(f->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::~string(local_180);
  }
  else {
    cppcms::string_key::string_key((string_key *)local_1c0,"member");
    std::
    _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
    ::find(&f->_M_t,(key_type *)local_1c0);
    pdVar3 = (double *)cppcms::json::value::number();
    dVar1 = *pdVar3;
    std::__cxx11::string::~string((string *)(local_1c0 + 0x10));
    std::__cxx11::string::~string(local_180);
    if ((dVar1 == 1.0) && (!NAN(dVar1))) {
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar4 = std::operator<<((ostream *)&oss,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x57);
  std::operator<<(poVar4," f.find(\"member\")!=f.end() && f.find(\"member\")->second.number()==1");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,(string *)local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles5cr(cppcms::json::object const &f) { TEST(f.find("member")!=f.end() && f.find("member")->second.number()==1); }